

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRConsoleNode.cpp
# Opt level: O3

void __thiscall MinVR::VRConsoleNode::println(VRConsoleNode *this,string *output)

{
  ostream *poVar1;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->m_stream,(output->_M_dataplus)._M_p,output->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void VRConsoleNode::println(const std::string &output) {
	*m_stream << output << std::endl;
}